

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_limit.cpp
# Opt level: O0

unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true> __thiscall
duckdb::StatisticsPropagator::PropagateStatistics
          (StatisticsPropagator *this,LogicalLimit *limit,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *node_ptr)

{
  LimitNodeType LVar1;
  unsigned_long *in_RCX;
  unsigned_long *in_RDX;
  NodeStatistics *in_RDI;
  BoundLimitNode *unaff_retaddr;
  idx_t constant_limit;
  _Head_base<0UL,_duckdb::NodeStatistics_*,_false> this_00;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  *in_stack_ffffffffffffffd0;
  StatisticsPropagator *in_stack_ffffffffffffffd8;
  
  this_00._M_head_impl = in_RDI;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                *)in_RDI,(size_type)in_RDI);
  PropagateStatistics(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>::~unique_ptr
            ((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
              *)0x19d2b3c);
  LVar1 = BoundLimitNode::Type((BoundLimitNode *)(in_RDX + 0xd));
  if (LVar1 == CONSTANT_VALUE) {
    BoundLimitNode::GetConstantValue(unaff_retaddr);
    make_uniq<duckdb::NodeStatistics,unsigned_long&,unsigned_long&>(in_RDX,in_RCX);
  }
  else {
    unique_ptr<duckdb::NodeStatistics,std::default_delete<duckdb::NodeStatistics>,true>::
    unique_ptr<std::default_delete<duckdb::NodeStatistics>,void>
              ((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                *)this_00._M_head_impl,in_RDI);
  }
  return (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)
         (__uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)
         this_00._M_head_impl;
}

Assistant:

unique_ptr<NodeStatistics> StatisticsPropagator::PropagateStatistics(LogicalLimit &limit,
                                                                     unique_ptr<LogicalOperator> &node_ptr) {
	// propagate statistics in the child node
	PropagateStatistics(limit.children[0]);
	// return the node stats, with as expected cardinality the amount specified in the limit
	if (limit.limit_val.Type() == LimitNodeType::CONSTANT_VALUE) {
		auto constant_limit = limit.limit_val.GetConstantValue();
		return make_uniq<NodeStatistics>(constant_limit, constant_limit);
	}
	return nullptr;
}